

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reset(match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,match_results *what,regex_impl *impl)

{
  extras_type *peVar1;
  
  peVar1 = match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_extras_(what);
  this->extras_ = peVar1;
  (this->action_list_).next = (actionable *)0x0;
  this->action_list_tail_ = &(this->action_list_).next;
  this->action_args_ = &what->args_;
  (this->attr_context_).attr_slots_ = (void **)0x0;
  (this->attr_context_).prev_attr_context_ = (attr_context *)0x0;
  (this->context_).prev_context_ =
       (match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  this->found_partial_match_ = false;
  sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unwind(&peVar1->sub_match_stack_);
  init_(this,impl,what);
  results_cache<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reclaim_all(&this->extras_->results_cache_,&what->nested_results_);
  return;
}

Assistant:

void reset(match_results &what, regex_impl const &impl)
    {
        this->extras_ = &core_access<BidiIter>::get_extras(what);
        this->action_list_.next = 0;
        this->action_list_tail_ = &action_list_.next;
        this->action_args_ = &core_access<BidiIter>::get_action_args(what);
        this->attr_context_ = attr_context();
        this->context_.prev_context_ = 0;
        this->found_partial_match_ = false;
        this->extras_->sub_match_stack_.unwind();
        this->init_(impl, what);
        this->extras_->results_cache_.reclaim_all(access::get_nested_results(what));
    }